

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O2

Bool Ppmd8_RangeDec_Init(CPpmd8 *p)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  
  p->Low = 0;
  p->Range = 0xffffffff;
  p->Code = 0;
  uVar2 = 0;
  iVar3 = 4;
  while (bVar4 = iVar3 != 0, iVar3 = iVar3 + -1, bVar4) {
    bVar1 = (*((p->Stream).In)->Read)((p->Stream).In);
    uVar2 = uVar2 << 8 | (uint)bVar1;
    p->Code = uVar2;
  }
  return (Bool)(uVar2 != 0xffffffff);
}

Assistant:

Bool Ppmd8_RangeDec_Init(CPpmd8 *p)
{
  unsigned i;
  p->Low = 0;
  p->Range = 0xFFFFFFFF;
  p->Code = 0;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream.In->Read(p->Stream.In);
  return (p->Code < 0xFFFFFFFF);
}